

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<const_char_*,_8UL> * __thiscall
spirv_cross::SmallVector<const_char_*,_8UL>::operator=
          (SmallVector<const_char_*,_8UL> *this,SmallVector<const_char_*,_8UL> *other)

{
  char **__ptr;
  size_t sVar1;
  char **ppcVar2;
  size_t sVar3;
  
  (this->super_VectorView<const_char_*>).buffer_size = 0;
  ppcVar2 = (other->super_VectorView<const_char_*>).ptr;
  if ((AlignedBuffer<const_char_*,_8UL> *)ppcVar2 == &other->stack_storage) {
    reserve(this,(other->super_VectorView<const_char_*>).buffer_size);
    sVar1 = (other->super_VectorView<const_char_*>).buffer_size;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        (this->super_VectorView<const_char_*>).ptr[sVar3] =
             (other->super_VectorView<const_char_*>).ptr[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    (this->super_VectorView<const_char_*>).buffer_size = sVar1;
    (other->super_VectorView<const_char_*>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<const_char_*>).ptr;
    if ((AlignedBuffer<const_char_*,_8UL> *)__ptr != &this->stack_storage) {
      free(__ptr);
      ppcVar2 = (other->super_VectorView<const_char_*>).ptr;
    }
    (this->super_VectorView<const_char_*>).ptr = ppcVar2;
    sVar1 = other->buffer_capacity;
    (this->super_VectorView<const_char_*>).buffer_size =
         (other->super_VectorView<const_char_*>).buffer_size;
    this->buffer_capacity = sVar1;
    (other->super_VectorView<const_char_*>).ptr = (char **)0x0;
    (other->super_VectorView<const_char_*>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}